

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * get_ARB1_const_array_varname(Context *ctx,int base,int size)

{
  char *pcVar1;
  char buf [64];
  
  snprintf(buf,0x40,"c_array_%d_%d",base,(ulong)(uint)size);
  pcVar1 = StrDup(ctx,buf);
  return pcVar1;
}

Assistant:

static const char *get_ARB1_const_array_varname(Context *ctx, int base, int size)
{
    char buf[64];
    get_ARB1_const_array_varname_in_buf(ctx, base, size, buf, sizeof (buf));
    return StrDup(ctx, buf);
}